

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O1

void Am_To_Top(Am_Object *object)

{
  bool bVar1;
  unsigned_short uVar2;
  int value;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  long *plVar5;
  ostream *poVar6;
  Am_Value_List components;
  Am_Object owner;
  Am_Object current;
  Am_Value_List local_60;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Slot local_30;
  
  bVar1 = Am_Object::Valid(object);
  if (!bVar1) {
    Am_Error("** Am_To_Top called with (0L) object\n");
  }
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)object,10);
  bVar1 = Am_Object::Valid(&local_50);
  if (bVar1) {
    Am_Object::Am_Object(&local_40,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(object,&local_40);
    Am_Object::~Am_Object(&local_40);
    if (bVar1) {
      Am_Object::Make_Unique(&local_50,0x82);
      Am_Value_List::Am_Value_List(&local_60);
      pAVar3 = Am_Object::Get(&local_50,0x82,0);
      Am_Value_List::operator=(&local_60,pAVar3);
      pAVar3 = Am_Object::Get(object,0x85,0);
      value = Am_Value::operator_cast_to_int(pAVar3);
      uVar2 = Am_Value_List::Length(&local_60);
      if (value + 1U != (uint)uVar2) {
        Am_Value_List::Start(&local_60);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Member(&local_60,pAVar4);
        Am_Value_List::Delete(&local_60,false);
        Am_Value_List::Next(&local_60);
        local_38.data = (Am_Object_Data *)0x0;
        while( true ) {
          bVar1 = Am_Value_List::Last(&local_60);
          if (bVar1) break;
          pAVar3 = Am_Value_List::Get(&local_60);
          Am_Object::operator=(&local_38,pAVar3);
          Am_Object::Set(&local_38,0x85,value,0);
          value = value + 1;
          Am_Value_List::Next(&local_60);
        }
        uVar2 = Am_Value_List::Length(&local_60);
        Am_Object::Set(object,0x85,(uint)uVar2,0);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(object);
        Am_Value_List::Add(&local_60,pAVar4,Am_TAIL,false);
        Am_Object::Note_Changed(&local_50,0x82);
        local_30 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)object,0x69);
        Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_repaint,0,&local_30);
        Am_Object::~Am_Object(&local_38);
      }
      Am_Value_List::~Am_Value_List(&local_60);
    }
    else {
      Am_Object::Am_Object(&local_48,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(object,&local_48);
      Am_Object::~Am_Object(&local_48);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Am_To_Top: Attempt to raise ",0x1f);
        poVar6 = operator<<((ostream *)&std::cerr,object);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," which is not a graphical object or window",0x2a);
        std::endl<char,std::char_traits<char>>(poVar6);
        Am_Error();
      }
      pAVar3 = Am_Object::Get(object,0x7d2,0);
      plVar5 = (long *)Am_Value::operator_cast_to_void_(pAVar3);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x28))(plVar5,0);
      }
    }
  }
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

void
Am_To_Top(Am_Object object)
{
  if (!object.Valid())
    Am_Error("** Am_To_Top called with (0L) object\n");
  Am_Object owner = object.Get_Owner();
  if (!owner.Valid())
    return;
  if (object.Is_Instance_Of(Am_Graphical_Object)) {
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    Am_Value_List components;
    components = owner.Get(Am_GRAPHICAL_PARTS);
    int rank = object.Get(Am_RANK);
    if (rank + 1 != components.Length()) {
      components.Start();
      components.Member(object);
      components.Delete(false);
      components.Next();
      Am_Object current;
      while (!components.Last()) {
        current = components.Get();
        current.Set(Am_RANK, rank);
        ++rank;
        components.Next();
      }
      object.Set(Am_RANK, (int)components.Length());
      components.Add(object, Am_TAIL, false);
      owner.Note_Changed(Am_GRAPHICAL_PARTS);
      Main_Demon_Queue.Enqueue(
          graphics_repaint, 0,
          ((Am_Object_Advanced &)object).Get_Slot(Am_VISIBLE));
    }
  } else if (object.Is_Instance_Of(Am_Window)) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(object.Get(Am_DRAWONABLE));
    if (draw)
      draw->Raise_Window(nullptr);
  } else {
    std::cerr << "** Am_To_Top: Attempt to raise " << object
              << " which is not "
                 "a graphical object or window"
              << std::endl;
    Am_Error();
  }
}